

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastInlineStringSplitMatch(Lowerer *this,Instr *instr)

{
  Instr *argoutInlineSpecialized;
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  BailOutKind BVar3;
  undefined4 *puVar4;
  Opnd *newDst;
  Opnd *this_00;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  RegOpnd *pRVar8;
  IndirOpnd *compareSrc1;
  BailOutInfo *bailoutInfo;
  HelperCallOpnd *pHVar9;
  IntConstOpnd *opndArg;
  LabelInstr *target;
  bool local_c9;
  LabelInstr *doneLabel;
  RegOpnd *stackAllocationOpnd;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseStackAllocationOpnd;
  JnHelperMethod helperMethod;
  Opnd *limit;
  Instr *helperCallInstr;
  Opnd *vtableOpnd;
  LabelInstr *local_58;
  LabelInstr *labelHelper;
  RegOpnd *local_48;
  Opnd *argsOpnd [2];
  Instr *tmpInstr;
  Opnd *src1;
  Opnd *callDst;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x501e,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  newDst = IR::Instr::GetDst(instr);
  this_00 = IR::Instr::GetSrc1(instr);
  pOVar5 = IR::Instr::GetSrc2(instr);
  pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
  pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
  argoutInlineSpecialized = (pSVar7->field_5).m_instrDef;
  bVar2 = IR::Instr::FetchOperands(instr,(Opnd **)&local_48,2);
  if (bVar2) {
    labelHelper._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&local_48->super_Opnd);
    bVar2 = ValueType::IsLikelyString((ValueType *)((long)&labelHelper + 6));
    local_c9 = true;
    if (bVar2) {
      local_c9 = IR::Opnd::IsTaggedInt(argsOpnd[0]);
    }
    if (local_c9 == false) {
      local_58 = IR::LabelInstr::New(Label,this->m_func,true);
      vtableOpnd._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&local_48->super_Opnd);
      bVar2 = ValueType::IsString((ValueType *)((long)&vtableOpnd + 6));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_48 = GetRegOpnd(this,&local_48->super_Opnd,instr,this->m_func,TyVar);
        pRVar8 = IR::Opnd::AsRegOpnd(&local_48->super_Opnd);
        GenerateStringTest(this,pRVar8,instr,local_58,(LabelInstr *)0x0,true);
      }
      bVar2 = IR::Opnd::IsNotTaggedValue(argsOpnd[0]);
      if (!bVar2) {
        LowererMD::GenerateObjectTest(&this->m_lowererMD,argsOpnd[0],instr,local_58,false);
      }
      pOVar5 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
      argsOpnd[0] = &GetRegOpnd(this,argsOpnd[0],instr,this->m_func,TyVar)->super_Opnd;
      pRVar8 = IR::Opnd::AsRegOpnd(argsOpnd[0]);
      compareSrc1 = IR::IndirOpnd::New(pRVar8,0,TyUint64,instr->m_func,false);
      InsertCompareBranch(this,&compareSrc1->super_Opnd,pOVar5,BrNeq_A,local_58,instr,false);
      limit = (Opnd *)IR::Instr::New(CALL,instr->m_func);
      if (newDst != (Opnd *)0x0) {
        IR::Instr::SetDst((Instr *)limit,newDst);
      }
      IR::Instr::InsertBefore(instr,(Instr *)limit);
      bVar2 = IR::Instr::HasBailOutInfo(instr);
      if (bVar2) {
        BVar3 = IR::Instr::GetBailOutKind(instr);
        bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar3);
        if (bVar2) {
          bailoutInfo = IR::Instr::GetBailOutInfo(instr);
          BVar3 = IR::Instr::GetBailOutKind(instr);
          limit = (Opnd *)AddBailoutToHelperCallInstr(this,(Instr *)limit,bailoutInfo,BVar3,instr);
        }
      }
      pHVar9 = IR::Opnd::AsHelperCallOpnd(this_00);
      if (pHVar9->m_fnHelper == HelperString_Split) {
        opndArg = IR::IntConstOpnd::New(0xffffffff,TyUint32,instr->m_func,false);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)limit,&opndArg->super_Opnd);
      }
      LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)limit,&local_48->super_Opnd);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)limit,argsOpnd[0]);
      LoadScriptContext(this,(Instr *)limit);
      autoReuseStackAllocationOpnd._20_4_ = 0;
      IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_98);
      if ((newDst == (Opnd *)0x0) || ((*(ushort *)&instr->field_0x36 >> 3 & 1) == 0)) {
        pHVar9 = IR::Opnd::AsHelperCallOpnd(this_00);
        if (pHVar9->m_fnHelper == HelperString_Match) {
          autoReuseStackAllocationOpnd._20_4_ = 0x1c2;
          if (newDst != (Opnd *)0x0) {
            autoReuseStackAllocationOpnd._20_4_ = 0x1c0;
          }
        }
        else if (pHVar9->m_fnHelper == HelperString_Split) {
          autoReuseStackAllocationOpnd._20_4_ = 0x1bf;
          if (newDst != (Opnd *)0x0) {
            autoReuseStackAllocationOpnd._20_4_ = 0x1bd;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x5093,"(false)","false");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
      else {
        pHVar9 = IR::Opnd::AsHelperCallOpnd(this_00);
        if (pHVar9->m_fnHelper == HelperString_Match) {
          autoReuseStackAllocationOpnd._20_4_ = 0x1c1;
        }
        else if (pHVar9->m_fnHelper == HelperString_Split) {
          autoReuseStackAllocationOpnd._20_4_ = 0x1be;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x5075,"(false)","false");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)local_98,&pRVar8->super_Opnd,this->m_func,true);
        valueType = IR::Opnd::GetValueType(newDst);
        IR::Opnd::SetValueType(&pRVar8->super_Opnd,valueType);
        GenerateMarkTempAlloc(this,pRVar8,Js::JavascriptArray::StackAllocationSize,(Instr *)limit);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)limit,&pRVar8->super_Opnd);
      }
      LowererMD::ChangeToHelperCall
                (&this->m_lowererMD,(Instr *)limit,autoReuseStackAllocationOpnd._20_4_,
                 (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      target = IR::LabelInstr::New(Label,this->m_func,false);
      IR::Instr::InsertAfter(instr,&target->super_Instr);
      IR::Instr::InsertBefore(instr,&local_58->super_Instr);
      InsertBranch(Br,true,target,&local_58->super_Instr);
      RelocateCallDirectToHelperPath(this,argoutInlineSpecialized,local_58);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineStringSplitMatch(IR::Instr * instr)
{
    // a.split(b,c (optional) )
    // We want to emit the fast path when
    //     1. c is not present, and
    //     2. 'a' is a string and 'b' is a regex.
    //
    // a.match(b)
    // We want to emit the fast path when 'a' is a string and 'b' is a regex.

    Assert(instr->m_opcode == Js::OpCode::CallDirect);
    IR::Opnd * callDst = instr->GetDst();

    //helperCallOpnd
    IR::Opnd * src1 = instr->GetSrc1();

    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = instr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2];
    if(!instr->FetchOperands(argsOpnd, 2))
    {
        return;
    }

    if(!argsOpnd[0]->GetValueType().IsLikelyString() || argsOpnd[1]->IsTaggedInt())
    {
        return;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if(!argsOpnd[0]->GetValueType().IsString())
    {
        argsOpnd[0] = GetRegOpnd(argsOpnd[0], instr, m_func, TyVar);
        this->GenerateStringTest(argsOpnd[0]->AsRegOpnd(), instr, labelHelper);
    }

    if(!argsOpnd[1]->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(argsOpnd[1], instr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    argsOpnd[1] = GetRegOpnd(argsOpnd[1], instr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(argsOpnd[1]->AsRegOpnd(), 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        instr);

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    instr->InsertBefore(helperCallInstr);
    if (instr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, instr->GetBailOutInfo(), instr->GetBailOutKind(), instr);
    }

    // [stackAllocationPointer, ]scriptcontext, regexp, input[, limit] (to be pushed in reverse order)

    if(src1->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperString_Split)
    {
        //limit
        //As we are optimizing only for two operands, make limit UINT_MAX
        IR::Opnd* limit = IR::IntConstOpnd::New(UINT_MAX, TyUint32, instr->m_func);
        this->m_lowererMD.LoadHelperArgument(helperCallInstr, limit);
    }

    //input, regexp
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, argsOpnd[0]);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, argsOpnd[1]);

    // script context
    LoadScriptContext(helperCallInstr);

    IR::JnHelperMethod helperMethod = IR::JnHelperMethod::HelperInvalid;
    IR::AutoReuseOpnd autoReuseStackAllocationOpnd;
    if(callDst && instr->dstIsTempObject)
    {
        switch(src1->AsHelperCallOpnd()->m_fnHelper)
        {
            case IR::JnHelperMethod::HelperString_Split:
                helperMethod = IR::JnHelperMethod::HelperRegExp_SplitResultUsedAndMayBeTemp;
                break;

            case IR::JnHelperMethod::HelperString_Match:
                helperMethod = IR::JnHelperMethod::HelperRegExp_MatchResultUsedAndMayBeTemp;
                break;

            default:
                Assert(false);
                __assume(false);
        }

        // Allocate some space on the stack for the result array
        IR::RegOpnd *const stackAllocationOpnd = IR::RegOpnd::New(TyVar, m_func);
        autoReuseStackAllocationOpnd.Initialize(stackAllocationOpnd, m_func);
        stackAllocationOpnd->SetValueType(callDst->GetValueType());
        GenerateMarkTempAlloc(stackAllocationOpnd, Js::JavascriptArray::StackAllocationSize, helperCallInstr);
        m_lowererMD.LoadHelperArgument(helperCallInstr, stackAllocationOpnd);
    }
    else
    {
        switch(src1->AsHelperCallOpnd()->m_fnHelper)
        {
            case IR::JnHelperMethod::HelperString_Split:
                helperMethod =
                    callDst
                        ? IR::JnHelperMethod::HelperRegExp_SplitResultUsed
                        : IR::JnHelperMethod::HelperRegExp_SplitResultNotUsed;
                break;

            case IR::JnHelperMethod::HelperString_Match:
                helperMethod =
                    callDst
                        ? IR::JnHelperMethod::HelperRegExp_MatchResultUsed
                        : IR::JnHelperMethod::HelperRegExp_MatchResultNotUsed;
                break;

            default:
                Assert(false);
                __assume(false);
        }
    }

    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);
    instr->InsertBefore(labelHelper);
    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}